

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_resetOrderVariableSetInEquivalentSetNotUnique_Test::
Validator_resetOrderVariableSetInEquivalentSetNotUnique_Test
          (Validator_resetOrderVariableSetInEquivalentSetNotUnique_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0015f1e8;
  return;
}

Assistant:

TEST(Validator, resetOrderVariableSetInEquivalentSetNotUnique)
{
    const std::vector<std::string> expectedIssues = {
        "Variable 'A' used in resets does not have unique order values across the equivalent variable set.",
    };

    libcellml::ValidatorPtr v = libcellml::Validator::create();

    auto m = setupResetOrderModel();

    auto c = m->component(1);
    auto r = c->reset(0);
    r->setOrder(1);

    v->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}